

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O0

void varianceFilter(Mat *image,int l)

{
  int iVar1;
  _InputArray *p_Var2;
  _OutputArray local_708;
  _InputOutputArray local_6f0;
  _InputArray local_6d8;
  _OutputArray local_6c0;
  _InputArray local_6a8;
  _InputArray local_690 [14];
  Mat local_530 [352];
  _InputArray local_3d0;
  Mat local_3b8 [8];
  Mat sigma;
  Point_<int> local_358;
  Size_<int> local_350;
  _OutputArray local_348;
  _InputArray local_330;
  _InputArray local_318 [14];
  _InputArray local_1b8;
  Mat local_1a0 [8];
  Mat sqrs;
  Point_<int> local_140;
  Size_<int> local_138;
  _OutputArray local_130;
  _InputArray local_118;
  Mat local_100 [8];
  Mat mean;
  _OutputArray local_90;
  Mat local_78 [8];
  Mat image32f;
  int l_local;
  Mat *image_local;
  
  cv::Mat::Mat(local_78);
  cv::_OutputArray::_OutputArray(&local_90,local_78);
  cv::Mat::convertTo((_OutputArray *)image,(int)&local_90,1.0,0.0);
  cv::_OutputArray::~_OutputArray(&local_90);
  cv::Mat::Mat(local_100);
  cv::_InputArray::_InputArray(&local_118,local_78);
  cv::_OutputArray::_OutputArray(&local_130,local_100);
  iVar1 = l * 2 + 1;
  cv::Size_<int>::Size_(&local_138,iVar1,iVar1);
  cv::Point_<int>::Point_(&local_140,-1,-1);
  cv::blur(&local_118,&local_130,&local_138,&local_140,4);
  cv::_OutputArray::~_OutputArray(&local_130);
  cv::_InputArray::~_InputArray(&local_118);
  cv::Mat::Mat(local_1a0);
  cv::_InputArray::_InputArray(&local_330,local_78);
  cv::Mat::mul(local_318,1.0);
  cv::_InputArray::_InputArray(&local_1b8,(MatExpr *)local_318);
  cv::_OutputArray::_OutputArray(&local_348,local_1a0);
  iVar1 = l * 2 + 1;
  cv::Size_<int>::Size_(&local_350,iVar1,iVar1);
  cv::Point_<int>::Point_(&local_358,-1,-1);
  cv::blur(&local_1b8,&local_348,&local_350,&local_358,4);
  cv::_OutputArray::~_OutputArray(&local_348);
  cv::_InputArray::~_InputArray(&local_1b8);
  cv::MatExpr::~MatExpr((MatExpr *)local_318);
  cv::_InputArray::~_InputArray(&local_330);
  cv::Mat::Mat(local_3b8);
  cv::_InputArray::_InputArray(&local_6a8,local_100);
  cv::Mat::mul(local_690,1.0);
  cv::operator-(local_530,(MatExpr *)local_1a0);
  cv::_InputArray::_InputArray(&local_3d0,(MatExpr *)local_530);
  cv::_OutputArray::_OutputArray(&local_6c0,local_3b8);
  cv::sqrt(&local_3d0,&local_6c0);
  cv::_OutputArray::~_OutputArray(&local_6c0);
  cv::_InputArray::~_InputArray(&local_3d0);
  cv::MatExpr::~MatExpr((MatExpr *)local_530);
  cv::MatExpr::~MatExpr((MatExpr *)local_690);
  cv::_InputArray::~_InputArray(&local_6a8);
  cv::_InputArray::_InputArray(&local_6d8,local_3b8);
  cv::_InputOutputArray::_InputOutputArray(&local_6f0,image);
  p_Var2 = (_InputArray *)cv::noArray();
  cv::normalize(&local_6d8,&local_6f0,0.0,255.0,0x20,-1,p_Var2);
  cv::_InputOutputArray::~_InputOutputArray(&local_6f0);
  cv::_InputArray::~_InputArray(&local_6d8);
  cv::_OutputArray::_OutputArray(&local_708,image);
  cv::Mat::convertTo((_OutputArray *)image,(int)&local_708,1.0,0.0);
  cv::_OutputArray::~_OutputArray(&local_708);
  cv::Mat::~Mat(local_3b8);
  cv::Mat::~Mat(local_1a0);
  cv::Mat::~Mat(local_100);
  cv::Mat::~Mat(local_78);
  return;
}

Assistant:

void varianceFilter(cv::Mat & image, int l) {
    cv::Mat image32f;
    image.convertTo(image32f, CV_32F);

    cv::Mat mean;
    cv::blur(image32f, mean, cv::Size(l*2+1, l*2+1));

    cv::Mat sqrs;
    cv::blur(image32f.mul(image32f), sqrs, cv::Size(l*2+1, l*2+1));

    cv::Mat sigma;
    cv::sqrt(sqrs - mean.mul(mean), sigma);

    cv::normalize(sigma, image, 0.0, 255.0, cv::NORM_MINMAX);
    image.convertTo(image, CV_8UC1);
}